

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O2

request diy::mpi::detail::iall_reduce
                  (communicator *comm,void *dataIn,void *dataOut,int count,datatype *type,
                  operation *op)

{
  request r;
  DIY_MPI_Request local_10;
  
  MPI_Iallreduce(dataIn,dataOut,count,(type->handle).data,(op->handle).data,(comm->comm_).data,
                 &local_10);
  return (request)(DIY_MPI_Request)local_10.data;
}

Assistant:

request iall_reduce(const communicator& comm,
                    const void* dataIn, void* dataOut, int count, const datatype& type,
                    const operation& op)
{
  request r;
#if DIY_HAS_MPI
  MPI_Iallreduce(dataIn, dataOut, count, mpi_cast(type.handle), mpi_cast(op.handle), mpi_cast(comm.handle()), &mpi_cast(r.handle));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), count);
  (void)comm; (void)op;
#endif
  return r;
}